

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

PointerType * __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::GetInvalidSchemaPointer
          (PointerType *__return_storage_ptr__,
          GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
          *this)

{
  SchemaType *pSVar1;
  
  if ((this->schemaStack_).stackTop_ == (this->schemaStack_).stack_) {
    __return_storage_ptr__->tokenCount_ = 0;
    __return_storage_ptr__->parseErrorOffset_ = 0;
    __return_storage_ptr__->nameBuffer_ = (Ch *)0x0;
    __return_storage_ptr__->tokens_ = (Token *)0x0;
    __return_storage_ptr__->allocator_ = (CrtAllocator *)0x0;
    __return_storage_ptr__->ownAllocator_ = (CrtAllocator *)0x0;
    __return_storage_ptr__->parseErrorCode_ = kPointerParseErrorNone;
  }
  else {
    pSVar1 = CurrentSchema(this);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::GenericPointer(__return_storage_ptr__,&pSVar1->pointer_);
  }
  return __return_storage_ptr__;
}

Assistant:

PointerType GetInvalidSchemaPointer() const {
        return schemaStack_.Empty() ? PointerType() : CurrentSchema().GetPointer();
    }